

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O3

OpenGLExtensions __thiscall QOpenGLExtensions::openGLExtensions(QOpenGLExtensions *this)

{
  QOpenGLFunctionsPrivate *pQVar1;
  QFlagsStorage<QOpenGLExtensions::OpenGLExtension> QVar2;
  
  pQVar1 = (this->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr;
  if (pQVar1 == (QOpenGLFunctionsPrivate *)0x0) {
    QVar2.i = 0;
  }
  else {
    QVar2.i = *(Int *)((long)&pQVar1[2].field_0 + 0x260);
    if (QVar2.i == 0xffffffff) {
      QVar2.i = qt_gl_resolve_extensions();
      *(Int *)((long)&pQVar1[2].field_0 + 0x260) = QVar2.i;
    }
  }
  return (QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4>)
         (QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4>)QVar2.i;
}

Assistant:

QOpenGLExtensions::OpenGLExtensions QOpenGLExtensions::openGLExtensions()
{
    QOpenGLFunctionsPrivateEx *d = static_cast<QOpenGLFunctionsPrivateEx *>(d_ptr);
    if (!d)
        return { };
    if (d->m_extensions == -1)
        d->m_extensions = qt_gl_resolve_extensions();
    return QOpenGLExtensions::OpenGLExtensions(d->m_extensions);
}